

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_serial_dump.cpp
# Opt level: O2

vector<interface,_std::allocator<interface>_> *
parse_interfaces(vector<interface,_std::allocator<interface>_> *__return_storage_ptr__,
                variables_map *variables)

{
  pointer pbVar1;
  any *operand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  runtime_error *this;
  pointer config_text;
  allocator local_71;
  interface local_70;
  
  (__return_storage_ptr__->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_70,"interface",&local_71);
  operand = (any *)boost::program_options::abstract_variables_map::operator[]((string *)variables);
  pvVar2 = boost::
           any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                     (operand);
  std::__cxx11::string::~string((string *)&local_70);
  pbVar1 = (pvVar2->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (config_text = (pvVar2->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; config_text != pbVar1;
      config_text = config_text + 1) {
    interface::interface(&local_70,config_text);
    std::vector<interface,_std::allocator<interface>_>::emplace_back<interface>
              (__return_storage_ptr__,&local_70);
    interface::~interface(&local_70);
  }
  if ((__return_storage_ptr__->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"no interface defined");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector< interface > parse_interfaces( const po::variables_map& variables )
{
    std::vector< interface > result;

    for ( const auto& config : variables[ "interface" ].as< std::vector< std::string > >() )
        result.push_back( interface( config ) );

    if ( result.empty() )
        throw std::runtime_error( "no interface defined" );

    return result;
}